

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O1

void __thiscall wasm::Options::Options(Options *this,string *command,string *description)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *types;
  string *psVar4;
  _func_void *p_Var5;
  undefined1 local_120 [8];
  string GeneralOption;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  _Any_data local_b8;
  _Manager_type local_a8;
  code *pcStack_a0;
  string local_98;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->debug = false;
  p_Var1 = &(this->extra)._M_t._M_impl.super__Rb_tree_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extra)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->positional = Zero;
  (this->positionalName)._M_dataplus._M_p = (pointer)&(this->positionalName).field_2;
  (this->positionalName)._M_string_length = 0;
  (this->positionalName).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->positionalAction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->positionalAction).super__Function_base._M_functor + 8) = 0;
  (this->positionalAction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->positionalAction)._M_invoker = (_Invoker_type)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->categories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = (undefined1  [8])&GeneralOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"General options","");
  types = getenv("BINARYEN_DEBUG");
  if (types != (char *)0x0) {
    setDebugEnabled(types);
  }
  GeneralOption.field_2._8_8_ = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&GeneralOption.field_2 + 8),"--version","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Output version information and exit","");
  pcVar3 = (command->_M_dataplus)._M_p;
  local_b8._M_unused._M_object = &local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + command->_M_string_length);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            (psVar4,local_b8._M_unused._M_object,local_b8._8_8_ + (long)local_b8._M_unused._0_8_);
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:76:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:76:7)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)psVar4;
  add(this,(string *)((long)&GeneralOption.field_2 + 8),&local_98,&local_78,(string *)local_120,Zero
      ,(Action *)&local_58,false);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((_Manager_type *)local_b8._M_unused._0_8_ != &local_a8) {
    operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)GeneralOption.field_2._8_8_ != &local_f0) {
    operator_delete((void *)GeneralOption.field_2._8_8_,local_f0._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"--help","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-h","");
  local_58._M_unused._M_object = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Show this help message and exit","");
  local_f8 = local_f0._M_local_buf + 8;
  pcVar3 = (command->_M_dataplus)._M_p;
  GeneralOption.field_2._8_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + command->_M_string_length);
  pcVar3 = (description->_M_dataplus)._M_p;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + description->_M_string_length);
  local_a8 = (_Manager_type)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  p_Var5 = (_func_void *)operator_new(0x48);
  *(undefined8 *)p_Var5 = GeneralOption.field_2._8_8_;
  *(_func_void **)(p_Var5 + 8) = p_Var5 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var5 + 8),local_f8,local_f8 + local_f0._M_allocated_capacity);
  *(_func_void **)(p_Var5 + 0x28) = p_Var5 + 0x38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var5 + 0x28),local_d8,local_d0 + (long)local_d8);
  pcStack_a0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:85:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:85:7)>
             ::_M_manager;
  local_b8._M_unused._M_function_pointer = p_Var5;
  add(this,&local_98,&local_78,(string *)&local_58,(string *)local_120,Zero,(Action *)&local_b8,
      false);
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  paVar2 = &local_98.field_2;
  if (local_f8 != local_f0._M_local_buf + 8) {
    operator_delete(local_f8,local_f0._8_8_ + 1);
  }
  if ((code **)local_58._M_unused._0_8_ != &local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  GeneralOption.field_2._8_8_ = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&GeneralOption.field_2 + 8),"--debug","");
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-d","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Print debug information to stderr","");
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:139:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp:139:7)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  add(this,(string *)((long)&GeneralOption.field_2 + 8),&local_98,&local_78,(string *)local_120,
      Optional,(Action *)&local_58,false);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)GeneralOption.field_2._8_8_ != &local_f0) {
    operator_delete((void *)GeneralOption.field_2._8_8_,local_f0._M_allocated_capacity + 1);
  }
  if (local_120 != (undefined1  [8])&GeneralOption._M_string_length) {
    operator_delete((void *)local_120,GeneralOption._M_string_length + 1);
  }
  return;
}

Assistant:

Options::Options(const std::string& command, const std::string& description)
  : debug(false), positional(Arguments::Zero) {
  std::string GeneralOption = "General options";

  if (getenv("BINARYEN_DEBUG")) {
    setDebugEnabled(getenv("BINARYEN_DEBUG"));
  }

  add("--version",
      "",
      "Output version information and exit",
      GeneralOption,
      Arguments::Zero,
      [command](Options*, const std::string&) {
        std::cout << command << " version " << PROJECT_VERSION << '\n';
        exit(0);
      });
  add("--help",
      "-h",
      "Show this help message and exit",
      GeneralOption,
      Arguments::Zero,
      [this, command, description](Options* o, const std::string&) {
        for (size_t i = 0; i < SCREEN_WIDTH; i++) {
          std::cout << '=';
        }
        std::cout << '\n';
        std::cout << command;
        if (positional != Arguments::Zero) {
          std::cout << ' ' << positionalName;
        }
        std::cout << "\n\n";
        printWrap(std::cout, 0, description);
        std::cout << '\n';
        for (size_t i = 0; i < SCREEN_WIDTH; i++) {
          std::cout << '=';
        }
        std::cout << '\n';
        size_t optionWidth = 0;
        for (const auto& o : options) {
          if (o.hidden) {
            continue;
          }
          optionWidth =
            std::max(optionWidth, o.longName.size() + o.shortName.size());
        }
        for (int i = int(categories.size()) - 1; i >= 0; i--) {
          auto& category = categories[i];
          std::cout << "\n\n" << category << ":\n";
          for (size_t i = 0; i < category.size() + 1; i++) {
            std::cout << '-';
          }
          std::cout << '\n';
          for (const auto& o : options) {
            if (o.hidden || o.category != category) {
              continue;
            }
            std::cout << '\n';
            bool long_n_short =
              o.longName.size() != 0 && o.shortName.size() != 0;
            size_t pad =
              1 + optionWidth - o.longName.size() - o.shortName.size();
            std::cout << "  " << o.longName << (long_n_short ? ',' : ' ')
                      << o.shortName << std::string(pad, ' ');
            printWrap(std::cout, optionWidth + 4, o.description);
            std::cout << '\n';
          }
        }
        std::cout << '\n';
        exit(EXIT_SUCCESS);
      });
  add("--debug",
      "-d",
      "Print debug information to stderr",
      GeneralOption,
      Arguments::Optional,
      [&](Options* o, const std::string& arguments) {
        debug = true;
        setDebugEnabled(arguments.c_str());
      });
}